

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

xmlSchemaTypePtr xmlSchemaInitBasicType(char *name,xmlSchemaValType type,xmlSchemaTypePtr baseType)

{
  int iVar1;
  xmlSchemaFacetPtr pxVar2;
  xmlSchemaTypePtr ret;
  xmlSchemaTypePtr baseType_local;
  xmlSchemaValType type_local;
  char *name_local;
  
  name_local = (char *)(*xmlMalloc)(0xe0);
  if ((xmlSchemaTypePtr)name_local == (xmlSchemaTypePtr)0x0) {
    xmlSchemaTypeErrMemory();
    name_local = (char *)0x0;
  }
  else {
    ((xmlSchemaTypePtr)name_local)->targetNamespace = (xmlChar *)0x0;
    ((xmlSchemaTypePtr)name_local)->attrUses = (void *)0x0;
    ((xmlSchemaTypePtr)name_local)->contentTypeDef = (xmlSchemaTypePtr)0x0;
    ((xmlSchemaTypePtr)name_local)->contModel = (xmlRegexpPtr)0x0;
    ((xmlSchemaTypePtr)name_local)->facetSet = (xmlSchemaFacetLinkPtr)0x0;
    ((xmlSchemaTypePtr)name_local)->refPrefix = (xmlChar *)0x0;
    *(undefined8 *)&((xmlSchemaTypePtr)name_local)->builtInType = 0;
    ((xmlSchemaTypePtr)name_local)->memberTypes = (xmlSchemaTypeLinkPtr)0x0;
    ((xmlSchemaTypePtr)name_local)->attributeUses = (xmlSchemaAttributeLinkPtr *)0x0;
    ((xmlSchemaTypePtr)name_local)->attributeWildcard = (xmlSchemaWildcardPtr)0x0;
    ((xmlSchemaTypePtr)name_local)->redef = (_xmlSchemaType *)0x0;
    *(undefined8 *)&((xmlSchemaTypePtr)name_local)->recurse = 0;
    ((xmlSchemaTypePtr)name_local)->baseType = (xmlSchemaTypePtr)0x0;
    ((xmlSchemaTypePtr)name_local)->facets = (xmlSchemaFacetPtr)0x0;
    ((xmlSchemaTypePtr)name_local)->base = (xmlChar *)0x0;
    ((xmlSchemaTypePtr)name_local)->baseNs = (xmlChar *)0x0;
    ((xmlSchemaTypePtr)name_local)->minOccurs = 0;
    ((xmlSchemaTypePtr)name_local)->maxOccurs = 0;
    ((xmlSchemaTypePtr)name_local)->flags = 0;
    ((xmlSchemaTypePtr)name_local)->contentType = XML_SCHEMA_CONTENT_UNKNOWN;
    ((xmlSchemaTypePtr)name_local)->attributes = (xmlSchemaAttributePtr_conflict)0x0;
    ((xmlSchemaTypePtr)name_local)->node = (xmlNodePtr)0x0;
    ((xmlSchemaTypePtr)name_local)->annot = (xmlSchemaAnnotPtr)0x0;
    ((xmlSchemaTypePtr)name_local)->subtypes = (xmlSchemaTypePtr)0x0;
    ((xmlSchemaTypePtr)name_local)->ref = (xmlChar *)0x0;
    ((xmlSchemaTypePtr)name_local)->refNs = (xmlChar *)0x0;
    ((xmlSchemaTypePtr)name_local)->name = (xmlChar *)0x0;
    ((xmlSchemaTypePtr)name_local)->id = (xmlChar *)0x0;
    *(undefined8 *)name_local = 0;
    ((xmlSchemaTypePtr)name_local)->next = (_xmlSchemaType *)0x0;
    ((xmlSchemaTypePtr)name_local)->name = (xmlChar *)name;
    ((xmlSchemaTypePtr)name_local)->targetNamespace = (xmlChar *)"http://www.w3.org/2001/XMLSchema";
    ((xmlSchemaTypePtr)name_local)->type = XML_SCHEMA_TYPE_BASIC;
    ((xmlSchemaTypePtr)name_local)->baseType = baseType;
    ((xmlSchemaTypePtr)name_local)->contentType = XML_SCHEMA_CONTENT_BASIC;
    if ((((type == XML_SCHEMAS_STRING) || (type - XML_SCHEMAS_DECIMAL < 0xd)) ||
        (type == XML_SCHEMAS_QNAME)) ||
       ((type - XML_SCHEMAS_NOTATION < 2 ||
        (type == XML_SCHEMAS_HEXBINARY || type == XML_SCHEMAS_BASE64BINARY)))) {
      ((xmlSchemaTypePtr)name_local)->flags = ((xmlSchemaTypePtr)name_local)->flags | 0x4000;
    }
    if (((type == XML_SCHEMAS_NMTOKENS) || (type == XML_SCHEMAS_IDREFS)) ||
       (type == XML_SCHEMAS_ENTITIES)) {
      ((xmlSchemaTypePtr)name_local)->flags = ((xmlSchemaTypePtr)name_local)->flags | 0x40;
      pxVar2 = xmlSchemaNewMinLengthFacet(1);
      ((xmlSchemaTypePtr)name_local)->facets = pxVar2;
      ((xmlSchemaTypePtr)name_local)->flags = ((xmlSchemaTypePtr)name_local)->flags | 0x8000000;
    }
    else if (type != XML_SCHEMAS_ANYTYPE && type != XML_SCHEMAS_ANYSIMPLETYPE) {
      ((xmlSchemaTypePtr)name_local)->flags = ((xmlSchemaTypePtr)name_local)->flags | 0x100;
    }
    iVar1 = xmlHashAddEntry2(xmlSchemaTypesBank,((xmlSchemaTypePtr)name_local)->name,
                             (xmlChar *)"http://www.w3.org/2001/XMLSchema",name_local);
    if (iVar1 < 0) {
      xmlSchemaFreeType((xmlSchemaTypePtr)name_local);
      name_local = (char *)0x0;
    }
    else {
      ((xmlSchemaTypePtr)name_local)->builtInType = type;
    }
  }
  return (xmlSchemaTypePtr)name_local;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaInitBasicType(const char *name, xmlSchemaValType type,
		       xmlSchemaTypePtr baseType) {
    xmlSchemaTypePtr ret;

    ret = (xmlSchemaTypePtr) xmlMalloc(sizeof(xmlSchemaType));
    if (ret == NULL) {
        xmlSchemaTypeErrMemory();
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaType));
    ret->name = (const xmlChar *)name;
    ret->targetNamespace = XML_SCHEMAS_NAMESPACE_NAME;
    ret->type = XML_SCHEMA_TYPE_BASIC;
    ret->baseType = baseType;
    ret->contentType = XML_SCHEMA_CONTENT_BASIC;
    /*
    * Primitive types.
    */
    switch (type) {
	case XML_SCHEMAS_STRING:
	case XML_SCHEMAS_DECIMAL:
	case XML_SCHEMAS_DATE:
	case XML_SCHEMAS_DATETIME:
	case XML_SCHEMAS_TIME:
	case XML_SCHEMAS_GYEAR:
	case XML_SCHEMAS_GYEARMONTH:
	case XML_SCHEMAS_GMONTH:
	case XML_SCHEMAS_GMONTHDAY:
	case XML_SCHEMAS_GDAY:
	case XML_SCHEMAS_DURATION:
	case XML_SCHEMAS_FLOAT:
	case XML_SCHEMAS_DOUBLE:
	case XML_SCHEMAS_BOOLEAN:
	case XML_SCHEMAS_ANYURI:
	case XML_SCHEMAS_HEXBINARY:
	case XML_SCHEMAS_BASE64BINARY:
	case XML_SCHEMAS_QNAME:
	case XML_SCHEMAS_NOTATION:
	    ret->flags |= XML_SCHEMAS_TYPE_BUILTIN_PRIMITIVE;
	    break;
	default:
	    break;
    }
    /*
    * Set variety.
    */
    switch (type) {
	case XML_SCHEMAS_ANYTYPE:
	case XML_SCHEMAS_ANYSIMPLETYPE:
	    break;
	case XML_SCHEMAS_IDREFS:
	case XML_SCHEMAS_NMTOKENS:
	case XML_SCHEMAS_ENTITIES:
	    ret->flags |= XML_SCHEMAS_TYPE_VARIETY_LIST;
	    ret->facets = xmlSchemaNewMinLengthFacet(1);
	    ret->flags |= XML_SCHEMAS_TYPE_HAS_FACETS;
	    break;
	default:
	    ret->flags |= XML_SCHEMAS_TYPE_VARIETY_ATOMIC;
	    break;
    }
    if (xmlHashAddEntry2(xmlSchemaTypesBank, ret->name,
	                 XML_SCHEMAS_NAMESPACE_NAME, ret) < 0) {
        xmlSchemaFreeType(ret);
        return(NULL);
    }
    ret->builtInType = type;
    return(ret);
}